

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void __thiscall
glslang::TReflectionTraverser::getOffsets
          (TReflectionTraverser *this,TType *type,TVector<int> *offsets)

{
  TTypeList *pTVar1;
  pointer piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int offset;
  int memberSize;
  int local_38;
  int local_34;
  
  iVar3 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar3 != '\0') {
    pTVar1 = (type->field_13).structure;
    local_38 = 0;
    local_34 = 0;
    if ((offsets->super_vector<int,_glslang::pool_allocator<int>_>).
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        lVar4 = (**(code **)(**(long **)((long)&((pTVar1->
                                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ).
                                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->type +
                                        lVar5) + 0x50))();
        if (*(int *)(lVar4 + 0x14) != -1) {
          lVar4 = (**(code **)(**(long **)((long)&((pTVar1->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                          lVar5) + 0x50))();
          local_38 = *(int *)(lVar4 + 0x14);
        }
        TIntermediate::updateOffset
                  (type,*(TType **)
                         ((long)&((pTVar1->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->type + lVar5),
                   &local_38,&local_34);
        piVar2 = (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
                 super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2[uVar6] = local_38;
        local_38 = local_38 + local_34;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar6 < (ulong)((long)(offsets->super_vector<int,_glslang::pool_allocator<int>_>).
                                     super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
    }
    return;
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

void getOffsets(const TType& type, TVector<int>& offsets)
    {
        const TTypeList& memberList = *type.getStruct();
        int memberSize = 0;
        int offset = 0;

        for (size_t m = 0; m < offsets.size(); ++m) {
            // if the user supplied an offset, snap to it now
            if (memberList[m].type->getQualifier().hasOffset())
                offset = memberList[m].type->getQualifier().layoutOffset;

            // calculate the offset of the next member and align the current offset to this member
            intermediate.updateOffset(type, *memberList[m].type, offset, memberSize);

            // save the offset of this member
            offsets[m] = offset;

            // update for the next member
            offset += memberSize;
        }
    }